

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_20(Mat *a,Mat *b,Mat *c,int op_type,Option *opt)

{
  int in_ECX;
  Option *in_stack_00000200;
  Mat *in_stack_00000208;
  Mat *in_stack_00000210;
  Mat *in_stack_00000218;
  undefined4 local_4;
  
  if (in_ECX == 0) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_add>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 1) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_sub>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 2) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 3) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 4) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_max>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 5) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 6) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 7) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_rsub>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 8) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_rdiv>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 9) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_rpow>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 10) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_atan2>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else if (in_ECX == 0xb) {
    local_4 = binary_op_broadcast_20<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
                        (in_stack_00000218,in_stack_00000210,in_stack_00000208,in_stack_00000200);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int binary_op_broadcast_20(const Mat& a, const Mat& b, Mat& c, int op_type, const Option& opt)
{
    using namespace BinaryOp_x86_avx_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_broadcast_20<binary_op_add>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_broadcast_20<binary_op_sub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_broadcast_20<binary_op_mul>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_broadcast_20<binary_op_div>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_broadcast_20<binary_op_max>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_broadcast_20<binary_op_min>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_POW) return binary_op_broadcast_20<binary_op_pow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_broadcast_20<binary_op_rsub>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_broadcast_20<binary_op_rdiv>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_broadcast_20<binary_op_rpow>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_broadcast_20<binary_op_atan2>(a, b, c, opt);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_broadcast_20<binary_op_ratan2>(a, b, c, opt);

    // should never reach here
    return 0;
}